

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O1

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::report_race
          (Fasttrack<std::shared_mutex> *this,uint32_t thr1,uint32_t thr2,bool wr1,bool wr2,
          VarState *var,size_t address)

{
  ushort uVar1;
  _List_node_base *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _List_node_base *p_Var5;
  undefined7 in_register_00000009;
  ctrl_t *pcVar6;
  size_t *psVar7;
  undefined3 in_register_00000081;
  iterator iVar8;
  iterator iVar9;
  list<unsigned_long,_std::allocator<unsigned_long>_> stack2;
  AccessEntry access2;
  AccessEntry access1;
  _List_node_base local_368;
  ulong local_358;
  uint32_t local_350;
  undefined4 local_34c;
  uint32_t local_348;
  undefined4 local_344;
  _List_node_base local_340;
  ulong local_330;
  Fasttrack<std::shared_mutex> *local_328;
  VarState *local_320;
  anon_union_8_1_a8a14541_for_iterator_1 local_318;
  undefined1 local_310 [16];
  ulong local_300;
  undefined1 local_258 [184];
  ushort local_1a0 [2];
  ulong local_19c;
  ulong local_190;
  ulong local_188;
  undefined8 local_180;
  size_t local_178;
  undefined8 local_170;
  size_t local_168 [16];
  ushort local_e8 [2];
  ulong local_e4;
  ulong local_d8;
  ulong local_d0;
  undefined8 local_c8;
  size_t local_c0;
  undefined8 local_b8;
  size_t local_b0 [16];
  
  local_344 = CONCAT31(in_register_00000081,wr2);
  local_34c = (undefined4)CONCAT71(in_register_00000009,wr1);
  local_310._0_8_ = CONCAT44(0,thr1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_310._0_8_;
  local_350 = thr1;
  local_320 = var;
  iVar8 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)&this->threads,(key_arg<unsigned_long> *)local_310,
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0));
  local_318 = iVar8.field_1;
  local_310._0_8_ = CONCAT44(0,thr2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_310._0_8_;
  local_348 = thr2;
  iVar9 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)&this->threads,(key_arg<unsigned_long> *)local_310,
                     SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0));
  pcVar6 = (this->threads).
           super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           .
           super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           .ctrl_ + (this->threads).
                    super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                    .
                    super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                    .capacity_;
  if ((iVar8.ctrl_ != pcVar6) && (iVar9.ctrl_ != pcVar6)) {
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_310,
               (StackTrace *)(*(long *)((long)local_318.slot_ + 8) + 0x38),address);
    local_358 = local_300;
    local_368._M_next = &local_368;
    local_368._M_prev = &local_368;
    p_Var5 = (_List_node_base *)local_310._0_8_;
    if ((_List_node_base *)local_310._0_8_ != (_List_node_base *)local_310) {
      *(_List_node_base **)local_310._8_8_ = &local_368;
      *(_List_node_base **)(local_310._0_8_ + 8) = &local_368;
      local_300 = 0;
      local_368._M_next = (_List_node_base *)local_310._0_8_;
      local_368._M_prev = (_List_node_base *)local_310._8_8_;
      p_Var5 = (_List_node_base *)local_310;
      local_310._0_8_ = (_List_node_base *)local_310;
      local_310._8_8_ = (_List_node_base *)local_310;
    }
    while (p_Var5 != (_List_node_base *)local_310) {
      p_Var2 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var5->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var5,0x18);
      p_Var5 = p_Var2;
    }
    StackTrace::return_stack_trace_abi_cxx11_
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_310,
               (StackTrace *)(*(long *)((long)iVar9.field_1.slot_ + 8) + 0x38),address);
    local_330 = local_300;
    local_340._M_next = &local_340;
    local_340._M_prev = &local_340;
    p_Var5 = (_List_node_base *)local_310._0_8_;
    if ((_List_node_base *)local_310._0_8_ != (_List_node_base *)local_310) {
      *(_List_node_base **)local_310._8_8_ = &local_340;
      *(_List_node_base **)(local_310._0_8_ + 8) = &local_340;
      local_300 = 0;
      local_340._M_next = (_List_node_base *)local_310._0_8_;
      local_340._M_prev = (_List_node_base *)local_310._8_8_;
      p_Var5 = (_List_node_base *)local_310;
      local_310._0_8_ = (_List_node_base *)local_310;
      local_310._8_8_ = (_List_node_base *)local_310;
    }
    while (p_Var2 = local_368._M_next, p_Var5 != (_List_node_base *)local_310) {
      p_Var2 = p_Var5->_M_next;
      operator_delete(p_Var5,0x18);
      p_Var5 = p_Var2;
    }
    while (local_328 = this, local_368._M_next = p_Var2, p_Var5 = local_340._M_next,
          local_190 = local_330, 0x10 < local_358) {
      local_358 = local_358 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var2,0x18);
      p_Var2 = local_368._M_next;
    }
    while (local_340._M_next = p_Var5, 0x10 < local_190) {
      local_330 = local_190 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x18);
      p_Var5 = local_340._M_next;
      local_190 = local_330;
    }
    local_e8[0] = 0;
    local_e4 = 0;
    local_330 = local_190;
    memset(&local_d8,0,0xa8);
    local_c0 = address;
    uVar1 = local_320->size;
    local_e4 = (ulong)local_350;
    local_b8 = 0;
    local_c8 = 0;
    local_e8[0] = (ushort)(byte)local_34c;
    local_d8 = local_358;
    if (local_368._M_next != &local_368) {
      psVar7 = local_b0;
      p_Var5 = local_368._M_next;
      do {
        *psVar7 = (size_t)p_Var5[1]._M_next;
        psVar7 = psVar7 + 1;
        p_Var5 = p_Var5->_M_next;
      } while (p_Var5 != &local_368);
    }
    local_1a0[0] = 0;
    local_19c = 0;
    local_d0 = (ulong)uVar1;
    memset(&local_190,0,0xa8);
    local_178 = address;
    local_19c = (ulong)local_348;
    local_170 = 0;
    local_180 = 0;
    local_1a0[0] = (ushort)(byte)local_344;
    if (local_340._M_next != &local_340) {
      psVar7 = local_168;
      p_Var5 = local_340._M_next;
      do {
        *psVar7 = (size_t)p_Var5[1]._M_next;
        psVar7 = psVar7 + 1;
        p_Var5 = p_Var5->_M_next;
      } while (p_Var5 != &local_340);
    }
    local_188 = (ulong)uVar1;
    memcpy((Race *)local_310,local_e8,0xb8);
    memcpy(local_258,local_1a0,0xb8);
    (*local_328->clb)((Race *)local_310,local_328->clb_context);
    p_Var5 = local_340._M_next;
    while (p_Var5 != &local_340) {
      p_Var2 = p_Var5->_M_next;
      operator_delete(p_Var5,0x18);
      p_Var5 = p_Var2;
    }
    p_Var5 = local_368._M_next;
    if (local_368._M_next != &local_368) {
      do {
        p_Var2 = p_Var5->_M_next;
        operator_delete(p_Var5,0x18);
        p_Var5 = p_Var2;
      } while (p_Var2 != &local_368);
    }
  }
  return;
}

Assistant:

void report_race(uint32_t thr1, uint32_t thr2, bool wr1, bool wr2,
                   const VarState& var, size_t address) const {
    auto it = threads.find(thr1);
    auto it2 = threads.find(thr2);
    auto it_end = threads.end();

    if (it == it_end ||
        it2 == it_end) {  // if thread_id is, because of finishing, not in stack
                          // traces anymore, return
      return;
    }
    std::list<size_t> stack1(
        std::move(it->second->get_stackDepot().return_stack_trace(address)));
    std::list<size_t> stack2(
        std::move(it2->second->get_stackDepot().return_stack_trace(address)));

    while (stack1.size() > Detector::max_stack_size) {
      stack1.pop_front();
    }
    while (stack2.size() > Detector::max_stack_size) {
      stack2.pop_front();
    }

    Detector::AccessEntry access1;
    access1.thread_id = thr1;
    access1.write = wr1;
    access1.accessed_memory = address;
    access1.access_size = var.size;
    access1.access_type = 0;
    access1.heap_block_begin = 0;
    access1.heap_block_size = 0;
    access1.onheap = false;
    access1.stack_size = stack1.size();
    std::copy(stack1.begin(), stack1.end(), access1.stack_trace.begin());

    Detector::AccessEntry access2;
    access2.thread_id = thr2;
    access2.write = wr2;
    access2.accessed_memory = address;
    access2.access_size = var.size;
    access2.access_type = 0;
    access2.heap_block_begin = 0;
    access2.heap_block_size = 0;
    access2.onheap = false;
    access2.stack_size = stack2.size();
    std::copy(stack2.begin(), stack2.end(), access2.stack_trace.begin());

    Detector::Race race;
    race.first = access1;
    race.second = access2;

    clb(&race, clb_context);
  }